

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall spvtools::opt::Instruction::UpdateDebugInfoFrom(Instruction *this,Instruction *from)

{
  bool bVar1;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *pvVar2;
  const_reference inst;
  DebugScope *scope;
  IRContext *pIVar3;
  DebugInfoManager *this_00;
  Instruction *from_local;
  Instruction *this_local;
  
  if (from != (Instruction *)0x0) {
    ClearDbgLineInsts(this);
    pvVar2 = dbg_line_insts(from);
    bVar1 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
            empty(pvVar2);
    if (!bVar1) {
      pvVar2 = dbg_line_insts(from);
      inst = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
             back(pvVar2);
      AddDebugLine(this,inst);
    }
    scope = GetDebugScope(from);
    SetDebugScope(this,scope);
    bVar1 = IsLineInst(this);
    if (!bVar1) {
      pIVar3 = context(this);
      bVar1 = IRContext::AreAnalysesValid(pIVar3,kAnalysisDebugInfo);
      if (bVar1) {
        pIVar3 = context(this);
        this_00 = IRContext::get_debug_info_mgr(pIVar3);
        analysis::DebugInfoManager::AnalyzeDebugInst(this_00,this);
      }
    }
  }
  return;
}

Assistant:

void Instruction::UpdateDebugInfoFrom(const Instruction* from) {
  if (from == nullptr) return;
  ClearDbgLineInsts();
  if (!from->dbg_line_insts().empty())
    AddDebugLine(&from->dbg_line_insts().back());
  SetDebugScope(from->GetDebugScope());
  if (!IsLineInst() &&
      context()->AreAnalysesValid(IRContext::kAnalysisDebugInfo)) {
    context()->get_debug_info_mgr()->AnalyzeDebugInst(this);
  }
}